

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferAtomicFunctions::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferAtomicFunctions *this,GLint work_group_size)

{
  ostream *poVar1;
  stringstream strstream;
  stringstream asStack_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(&local_188,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n${SHADER_IMAGE_ATOMIC_REQUIRE}\n\nprecision highp float;\n\nlayout (local_size_x = "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,work_group_size);
  std::operator<<(poVar1,
                  " ) in;\n\nlayout(r32ui, binding = 0) coherent uniform highp uimageBuffer uimage_buffer;\n\nvoid main(void)\n{\n   uint value = imageLoad( uimage_buffer, int(gl_LocalInvocationID.x) + 1 ).x;\n   imageAtomicAdd( uimage_buffer, 0 , value );\n\n   memoryBarrier();\n   barrier();\n\n   value = imageLoad( uimage_buffer, 0 ).x;\n   imageAtomicCompSwap( uimage_buffer, int(gl_LocalInvocationID.x) + 1, gl_LocalInvocationID.x + 1u, value );\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferAtomicFunctions::getComputeShaderCode(glw::GLint work_group_size) const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "${SHADER_IMAGE_ATOMIC_REQUIRE}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "layout (local_size_x = "
			  << work_group_size << " ) in;\n"
									"\n"
									"layout(r32ui, binding = 0) coherent uniform highp uimageBuffer uimage_buffer;\n"
									"\n"
									"void main(void)\n"
									"{\n"
									"   uint value = imageLoad( uimage_buffer, int(gl_LocalInvocationID.x) + 1 ).x;\n"
									"   imageAtomicAdd( uimage_buffer, 0 , value );\n"
									"\n"
									"   memoryBarrier();\n"
									"   barrier();\n"
									"\n"
									"   value = imageLoad( uimage_buffer, 0 ).x;\n"
									"   imageAtomicCompSwap( uimage_buffer, int(gl_LocalInvocationID.x) + 1, "
									"gl_LocalInvocationID.x + 1u, value );\n"
									"}\n";

	return strstream.str();
}